

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::StencilTestInstance::verifyImage
          (TestStatus *__return_storage_ptr__,StencilTestInstance *this)

{
  undefined4 queueFamilyIndex_00;
  undefined8 uVar1;
  uint surfaceWidth;
  uint surfaceHeight;
  float fVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  DeviceInterface *vk_00;
  VkDevice device;
  VkQueue queue_00;
  InstanceInterface *vk_01;
  VkPhysicalDevice physicalDevice;
  Handle<(vk::HandleType)9> *pHVar6;
  TextureLevel *pTVar7;
  TestContext *this_00;
  TestLog *log;
  allocator<char> local_849;
  string local_848;
  undefined4 local_828;
  allocator<char> local_821;
  string local_820;
  Vector<int,_3> local_7fc;
  Vector<unsigned_int,_4> local_7f0;
  ConstPixelBufferAccess local_7e0;
  ConstPixelBufferAccess local_7b8;
  DefaultDeleter<tcu::TextureLevel> local_789;
  deUint64 local_788;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> local_780;
  undefined1 local_770 [8];
  UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  undefined1 local_558 [8];
  SimpleAllocator allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice vkDevice;
  DeviceInterface *vk;
  __normal_iterator<vkt::pipeline::Vertex4RGBA_*,_std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>_>
  local_310;
  __normal_iterator<vkt::pipeline::Vertex4RGBA_*,_std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>_>
  local_308;
  __normal_iterator<vkt::pipeline::Vertex4RGBA_*,_std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>_>
  local_300;
  __normal_iterator<vkt::pipeline::Vertex4RGBA_*,_std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>_>
  local_2f8;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> local_2f0;
  int local_2d4;
  undefined1 auStack_2d0 [4];
  int quadNdx;
  Vertex4RGBA cwVertex1;
  size_t vertexNdx;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> cwVertices;
  StencilState *refStencilBack;
  StencilState *refStencilFront;
  undefined1 local_268 [8];
  RenderState renderState;
  bool compareOk;
  ReferenceRenderer refRenderer;
  Program program;
  undefined1 local_a8 [8];
  ColorFragmentShader fragmentShader;
  ColorVertexShader vertexShader;
  TextureFormat tcuStencilFormat;
  TextureFormat tcuColorFormat;
  StencilTestInstance *this_local;
  
  tcuStencilFormat = ::vk::mapVkFormat(this->m_colorFormat);
  vertexShader.super_VertexShader.m_outputs.
  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)::vk::mapVkFormat(this->m_stencilFormat);
  ColorVertexShader::ColorVertexShader((ColorVertexShader *)&fragmentShader.m_depthStencilFormat);
  ColorFragmentShader::ColorFragmentShader
            ((ColorFragmentShader *)local_a8,&tcuStencilFormat,
             (TextureFormat *)
             &vertexShader.super_VertexShader.m_outputs.
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  rr::Program::Program
            ((Program *)&refRenderer.m_program,(VertexShader *)&fragmentShader.m_depthStencilFormat,
             (FragmentShader *)local_a8,(GeometryShader *)0x0);
  surfaceWidth = tcu::Vector<unsigned_int,_2>::x(&this->m_renderSize);
  surfaceHeight = tcu::Vector<unsigned_int,_2>::y(&this->m_renderSize);
  ReferenceRenderer::ReferenceRenderer
            ((ReferenceRenderer *)&renderState.viewportOrientation,surfaceWidth,surfaceHeight,1,
             &tcuStencilFormat,
             (TextureFormat *)
             &vertexShader.super_VertexShader.m_outputs.
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Program *)&refRenderer.m_program);
  renderState.restart.restartIndex._3_1_ = 0;
  ReferenceRenderer::getViewportState
            ((ViewportState *)&refStencilFront,(ReferenceRenderer *)&renderState.viewportOrientation
            );
  rr::RenderState::RenderState
            ((RenderState *)local_268,(ViewportState *)&refStencilFront,
             VIEWPORTORIENTATION_LOWER_LEFT);
  renderState.fragOps.stencilStates[1].dpPass._0_1_ = STENCILOP_ZERO;
  renderState.fragOps.stencilStates[1].writeMask = mapVkCompareOp(VK_COMPARE_OP_LESS);
  renderState.fragOps.scissorRectangle.width._0_1_ = 1;
  cwVertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&renderState.fragOps.stencilStates[0].dpPass;
  renderState.fragOps.stencilStates[0].ref = mapVkStencilOp((this->m_stencilOpStateFront).failOp);
  renderState.fragOps.stencilStates[0].compMask =
       mapVkStencilOp((this->m_stencilOpStateFront).depthFailOp);
  renderState.fragOps.stencilStates[0].sFail = mapVkStencilOp((this->m_stencilOpStateFront).passOp);
  renderState.fragOps.scissorRectangle.height =
       mapVkCompareOp((this->m_stencilOpStateFront).compareOp);
  fVar2 = (float)mapVkStencilOp((this->m_stencilOpStateBack).failOp);
  ((cwVertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage)->position).m_data[3] = fVar2;
  fVar2 = (float)mapVkStencilOp((this->m_stencilOpStateBack).depthFailOp);
  ((cwVertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage)->color).m_data[0] = fVar2;
  fVar2 = (float)mapVkStencilOp((this->m_stencilOpStateBack).passOp);
  ((cwVertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage)->color).m_data[1] = fVar2;
  fVar2 = (float)mapVkCompareOp((this->m_stencilOpStateBack).compareOp);
  ((cwVertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage)->position).m_data[0] = fVar2;
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
            ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
             &vertexNdx,&this->m_vertices);
  cwVertex1.color.m_data[2] = 0.0;
  cwVertex1.color.m_data[3] = 0.0;
  while( true ) {
    uVar1 = cwVertex1.color.m_data._8_8_;
    sVar3 = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
            size((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
                 &vertexNdx);
    if (sVar3 - 2 <= (ulong)uVar1) break;
    pvVar4 = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
             operator[]((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                         *)&vertexNdx,cwVertex1.color.m_data._8_8_ + 1);
    Vertex4RGBA::Vertex4RGBA((Vertex4RGBA *)auStack_2d0,pvVar4);
    pvVar4 = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
             operator[]((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                         *)&vertexNdx,cwVertex1.color.m_data._8_8_ + 2);
    pvVar5 = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
             operator[]((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                         *)&vertexNdx,cwVertex1.color.m_data._8_8_ + 1);
    *(undefined8 *)(pvVar5->position).m_data = *(undefined8 *)(pvVar4->position).m_data;
    *(undefined8 *)((pvVar5->position).m_data + 2) = *(undefined8 *)((pvVar4->position).m_data + 2);
    *(undefined8 *)(pvVar5->color).m_data = *(undefined8 *)(pvVar4->color).m_data;
    *(undefined8 *)((pvVar5->color).m_data + 2) = *(undefined8 *)((pvVar4->color).m_data + 2);
    pvVar4 = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
             operator[]((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                         *)&vertexNdx,cwVertex1.color.m_data._8_8_ + 2);
    *(undefined8 *)(pvVar4->position).m_data = _auStack_2d0;
    *(undefined8 *)((pvVar4->position).m_data + 2) = cwVertex1.position.m_data._0_8_;
    *(undefined8 *)(pvVar4->color).m_data = cwVertex1.position.m_data._8_8_;
    *(undefined8 *)((pvVar4->color).m_data + 2) = cwVertex1.color.m_data._0_8_;
    cwVertex1.color.m_data._8_8_ = cwVertex1.color.m_data._8_8_ + 3;
  }
  for (local_2d4 = 0; local_2d4 < 4; local_2d4 = local_2d4 + 1) {
    renderState.fragOps._20_4_ =
         *(undefined4 *)
          (pipeline::(anonymous_namespace)::StencilTest::s_stencilStateConfigs +
          (long)local_2d4 * 0x18 + 8);
    renderState.fragOps.stencilStates[0].func =
         *(TestFunc *)
          (pipeline::(anonymous_namespace)::StencilTest::s_stencilStateConfigs +
          (long)local_2d4 * 0x18);
    renderState.fragOps.stencilStates[0].dpFail =
         *(StencilOp *)
          (pipeline::(anonymous_namespace)::StencilTest::s_stencilStateConfigs +
          (long)local_2d4 * 0x18 + 4);
    ((cwVertices.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage)->position).m_data[1] =
         *(float *)(pipeline::(anonymous_namespace)::StencilTest::s_stencilStateConfigs +
                   (long)local_2d4 * 0x18 + 0x14);
    ((cwVertices.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage)->position).m_data[2] =
         *(float *)(pipeline::(anonymous_namespace)::StencilTest::s_stencilStateConfigs +
                   (long)local_2d4 * 0x18 + 0xc);
    ((cwVertices.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage)->color).m_data[2] =
         *(float *)(pipeline::(anonymous_namespace)::StencilTest::s_stencilStateConfigs +
                   (long)local_2d4 * 0x18 + 0x10);
    local_300._M_current =
         (Vertex4RGBA *)
         std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::begin
                   ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     *)&vertexNdx);
    local_2f8 = __gnu_cxx::
                __normal_iterator<vkt::pipeline::Vertex4RGBA_*,_std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>_>
                ::operator+(&local_300,(long)(local_2d4 * 6));
    local_310._M_current =
         (Vertex4RGBA *)
         std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::begin
                   ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     *)&vertexNdx);
    local_308 = __gnu_cxx::
                __normal_iterator<vkt::pipeline::Vertex4RGBA_*,_std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>_>
                ::operator+(&local_310,(long)(local_2d4 * 6 + 6));
    std::allocator<vkt::pipeline::Vertex4RGBA>::allocator
              ((allocator<vkt::pipeline::Vertex4RGBA> *)((long)&vk + 7));
    std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
    vector<__gnu_cxx::__normal_iterator<vkt::pipeline::Vertex4RGBA*,std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>>,void>
              ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
               &local_2f0,local_2f8,local_308,
               (allocator<vkt::pipeline::Vertex4RGBA> *)((long)&vk + 7));
    ReferenceRenderer::draw
              ((ReferenceRenderer *)&renderState.viewportOrientation,(RenderState *)local_268,
               PRIMITIVETYPE_TRIANGLES,&local_2f0);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::~vector
              (&local_2f0);
    std::allocator<vkt::pipeline::Vertex4RGBA>::~allocator
              ((allocator<vkt::pipeline::Vertex4RGBA> *)((long)&vk + 7));
  }
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::~vector
            ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
             &vertexNdx);
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  allocator.m_memProps.memoryHeaps[0xf]._12_4_ =
       Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  vk_01 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)
             &result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
              m_data.field_0x8,vk_01,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            ((SimpleAllocator *)local_558,vk_00,device,
             (VkPhysicalDeviceMemoryProperties *)
             &result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
              m_data.field_0x8);
  queueFamilyIndex_00 = allocator.m_memProps.memoryHeaps[0xf]._12_4_;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  local_788 = pHVar6->m_internal;
  readColorAttachment(&local_780,vk_00,device,queue_00,queueFamilyIndex_00,(Allocator *)local_558,
                      (VkImage)local_788,this->m_colorFormat,&this->m_renderSize);
  pTVar7 = de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::release
                     (&local_780);
  de::DefaultDeleter<tcu::TextureLevel>::DefaultDeleter(&local_789);
  de::details::UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::UniquePtr
            ((UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_770,
             pTVar7);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
            (&local_780);
  this_00 = Context::getTestContext((this->super_TestInstance).m_context);
  log = tcu::TestContext::getLog(this_00);
  ReferenceRenderer::getAccess
            ((PixelBufferAccess *)&local_7b8,(ReferenceRenderer *)&renderState.viewportOrientation);
  pTVar7 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
           operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      local_770);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_7e0,pTVar7);
  tcu::Vector<unsigned_int,_4>::Vector(&local_7f0,2,2,2,2);
  tcu::Vector<int,_3>::Vector(&local_7fc,1,1,0);
  renderState.restart.restartIndex._3_1_ =
       tcu::intThresholdPositionDeviationCompare
                 (log,"IntImageCompare","Image comparison",&local_7b8,&local_7e0,&local_7f0,
                  &local_7fc,true,COMPARE_LOG_RESULT);
  de::details::UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~UniquePtr
            ((UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_770);
  ::vk::SimpleAllocator::~SimpleAllocator((SimpleAllocator *)local_558);
  if ((renderState.restart.restartIndex._3_1_ & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_848,"Image mismatch",&local_849);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_848);
    std::__cxx11::string::~string((string *)&local_848);
    std::allocator<char>::~allocator(&local_849);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_820,"Result image matches reference",&local_821);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_820);
    std::__cxx11::string::~string((string *)&local_820);
    std::allocator<char>::~allocator(&local_821);
  }
  local_828 = 1;
  ReferenceRenderer::~ReferenceRenderer((ReferenceRenderer *)&renderState.viewportOrientation);
  ColorFragmentShader::~ColorFragmentShader((ColorFragmentShader *)local_a8);
  ColorVertexShader::~ColorVertexShader((ColorVertexShader *)&fragmentShader.m_depthStencilFormat);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus StencilTestInstance::verifyImage (void)
{
	const tcu::TextureFormat	tcuColorFormat		= mapVkFormat(m_colorFormat);
	const tcu::TextureFormat	tcuStencilFormat	= mapVkFormat(m_stencilFormat);
	const ColorVertexShader		vertexShader;
	const ColorFragmentShader	fragmentShader		(tcuColorFormat, tcuStencilFormat);
	const rr::Program			program				(&vertexShader, &fragmentShader);
	ReferenceRenderer			refRenderer			(m_renderSize.x(), m_renderSize.y(), 1, tcuColorFormat, tcuStencilFormat, &program);
	bool						compareOk			= false;

	// Render reference image
	{
		// Set depth state
		rr::RenderState renderState(refRenderer.getViewportState());

		renderState.fragOps.depthTestEnabled	= true;
		renderState.fragOps.depthFunc			= mapVkCompareOp(VK_COMPARE_OP_LESS);
		renderState.fragOps.stencilTestEnabled	= true;

		rr::StencilState& refStencilFront	= renderState.fragOps.stencilStates[rr::FACETYPE_FRONT];
		rr::StencilState& refStencilBack	= renderState.fragOps.stencilStates[rr::FACETYPE_BACK];

		refStencilFront.sFail		= mapVkStencilOp(m_stencilOpStateFront.failOp);
		refStencilFront.dpFail		= mapVkStencilOp(m_stencilOpStateFront.depthFailOp);
		refStencilFront.dpPass		= mapVkStencilOp(m_stencilOpStateFront.passOp);
		refStencilFront.func		= mapVkCompareOp(m_stencilOpStateFront.compareOp);

		refStencilBack.sFail		= mapVkStencilOp(m_stencilOpStateBack.failOp);
		refStencilBack.dpFail		= mapVkStencilOp(m_stencilOpStateBack.depthFailOp);
		refStencilBack.dpPass		= mapVkStencilOp(m_stencilOpStateBack.passOp);
		refStencilBack.func			= mapVkCompareOp(m_stencilOpStateBack.compareOp);

		// Reverse winding of vertices, as Vulkan screen coordinates start at upper left
		std::vector<Vertex4RGBA> cwVertices(m_vertices);
		for (size_t vertexNdx = 0; vertexNdx < cwVertices.size() - 2; vertexNdx += 3)
		{
			const Vertex4RGBA cwVertex1	= cwVertices[vertexNdx + 1];

			cwVertices[vertexNdx + 1]	= cwVertices[vertexNdx + 2];
			cwVertices[vertexNdx + 2]	= cwVertex1;
		}

		for (int quadNdx = 0; quadNdx < StencilTest::QUAD_COUNT; quadNdx++)
		{
			refStencilFront.ref			= (int)StencilTest::s_stencilStateConfigs[quadNdx].frontRef;
			refStencilFront.compMask	= StencilTest::s_stencilStateConfigs[quadNdx].frontReadMask;
			refStencilFront.writeMask	= StencilTest::s_stencilStateConfigs[quadNdx].frontWriteMask;

			refStencilBack.ref			= (int)StencilTest::s_stencilStateConfigs[quadNdx].backRef;
			refStencilBack.compMask		= StencilTest::s_stencilStateConfigs[quadNdx].backReadMask;
			refStencilBack.writeMask	= StencilTest::s_stencilStateConfigs[quadNdx].backWriteMask;

			refRenderer.draw(renderState,
							 rr::PRIMITIVETYPE_TRIANGLES,
							 std::vector<Vertex4RGBA>(cwVertices.begin() + quadNdx * 6,
													  cwVertices.begin() + (quadNdx + 1) * 6));
		}
	}

	// Compare result with reference image
	{
		const DeviceInterface&				vk					= m_context.getDeviceInterface();
		const VkDevice						vkDevice			= m_context.getDevice();
		const VkQueue						queue				= m_context.getUniversalQueue();
		const deUint32						queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
		SimpleAllocator						allocator			(vk, vkDevice, getPhysicalDeviceMemoryProperties(m_context.getInstanceInterface(), m_context.getPhysicalDevice()));
		de::UniquePtr<tcu::TextureLevel>	result				(readColorAttachment(vk, vkDevice, queue, queueFamilyIndex, allocator, *m_colorImage, m_colorFormat, m_renderSize).release());

		compareOk = tcu::intThresholdPositionDeviationCompare(m_context.getTestContext().getLog(),
															  "IntImageCompare",
															  "Image comparison",
															  refRenderer.getAccess(),
															  result->getAccess(),
															  tcu::UVec4(2, 2, 2, 2),
															  tcu::IVec3(1, 1, 0),
															  true,
															  tcu::COMPARE_LOG_RESULT);
	}

	if (compareOk)
		return tcu::TestStatus::pass("Result image matches reference");
	else
		return tcu::TestStatus::fail("Image mismatch");
}